

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::TarjanVisit(cmComputeComponentGraph *this,int i)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  size_type sVar6;
  reference pvVar7;
  iterator __first;
  iterator __last;
  int local_54;
  vector<int,_std::allocator<int>_> *pvStack_50;
  int j_1;
  NodeList *component;
  int c;
  int j;
  cmGraphEdge *ni;
  const_iterator __end1;
  const_iterator __begin1;
  EdgeList *__range1;
  EdgeList *nl;
  cmComputeComponentGraph *pcStack_10;
  int i_local;
  cmComputeComponentGraph *this_local;
  
  vVar1 = this->TarjanWalkId;
  nl._4_4_ = i;
  pcStack_10 = this;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->TarjanVisited,(long)i);
  iVar3 = nl._4_4_;
  *pvVar4 = vVar1;
  pvVar5 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(long)nl._4_4_);
  pvVar5->Root = iVar3;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->TarjanComponents,(long)nl._4_4_);
  *pvVar4 = -1;
  iVar3 = this->TarjanIndex + 1;
  this->TarjanIndex = iVar3;
  pvVar5 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(long)nl._4_4_);
  pvVar5->VisitIndex = iVar3;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            (&this->TarjanStack,(value_type *)((long)&nl + 4));
  this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                       (&this->InputGraph->
                         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                        (long)nl._4_4_)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  __end1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
  ni = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                     *)&ni), bVar2) {
    _c = __gnu_cxx::
         __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
         ::operator*(&__end1);
    component._4_4_ = cmGraphEdge::operator_cast_to_int(_c);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->TarjanVisited,(long)component._4_4_);
    if ((*pvVar4 < 1) ||
       (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->TarjanVisited,(long)component._4_4_),
       this->TarjanWalkId <= *pvVar4)) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->TarjanVisited,(long)component._4_4_);
      if (*pvVar4 == 0) {
        TarjanVisit(this,component._4_4_);
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->TarjanComponents,(long)component._4_4_);
      if (*pvVar4 < 0) {
        pvVar5 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(long)component._4_4_);
        pvVar5 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(long)pvVar5->Root);
        iVar3 = pvVar5->VisitIndex;
        pvVar5 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(long)nl._4_4_);
        pvVar5 = std::
                 vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ::operator[](&this->TarjanEntries,(long)pvVar5->Root);
        if (iVar3 < pvVar5->VisitIndex) {
          pvVar5 = std::
                   vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                   ::operator[](&this->TarjanEntries,(long)component._4_4_);
          iVar3 = pvVar5->Root;
          pvVar5 = std::
                   vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                   ::operator[](&this->TarjanEntries,(long)nl._4_4_);
          pvVar5->Root = iVar3;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
    ::operator++(&__end1);
  }
  pvVar5 = std::
           vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ::operator[](&this->TarjanEntries,(long)nl._4_4_);
  if (pvVar5->Root == nl._4_4_) {
    sVar6 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(&this->Components);
    component._0_4_ = (int)sVar6;
    std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::emplace_back<>
              (&this->Components);
    pvStack_50 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                            (&this->Components,(long)(int)component)->
                  super_vector<int,_std::allocator<int>_>;
    do {
      pvVar7 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->TarjanStack);
      local_54 = *pvVar7;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->TarjanStack);
      vVar1 = (int)component;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->TarjanComponents,(long)local_54);
      iVar3 = nl._4_4_;
      *pvVar4 = vVar1;
      pvVar5 = std::
               vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
               ::operator[](&this->TarjanEntries,(long)local_54);
      pvVar5->Root = iVar3;
      std::vector<int,_std::allocator<int>_>::push_back(pvStack_50,&local_54);
    } while (local_54 != nl._4_4_);
    __first = std::vector<int,_std::allocator<int>_>::begin(pvStack_50);
    __last = std::vector<int,_std::allocator<int>_>::end(pvStack_50);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TarjanVisit(int i)
{
  // We are now visiting this node.
  this->TarjanVisited[i] = this->TarjanWalkId;

  // Initialize the entry.
  this->TarjanEntries[i].Root = i;
  this->TarjanComponents[i] = -1;
  this->TarjanEntries[i].VisitIndex = ++this->TarjanIndex;
  this->TarjanStack.push(i);

  // Follow outgoing edges.
  EdgeList const& nl = this->InputGraph[i];
  for (cmGraphEdge const& ni : nl) {
    int j = ni;

    // Ignore edges to nodes that have been reached by a previous DFS
    // walk.  Since we did not reach the current node from that walk
    // it must not belong to the same component and it has already
    // been assigned to a component.
    if (this->TarjanVisited[j] > 0 &&
        this->TarjanVisited[j] < this->TarjanWalkId) {
      continue;
    }

    // Visit the destination if it has not yet been visited.
    if (!this->TarjanVisited[j]) {
      this->TarjanVisit(j);
    }

    // If the destination has not yet been assigned to a component,
    // check if it has a better root for the current object.
    if (this->TarjanComponents[j] < 0) {
      if (this->TarjanEntries[this->TarjanEntries[j].Root].VisitIndex <
          this->TarjanEntries[this->TarjanEntries[i].Root].VisitIndex) {
        this->TarjanEntries[i].Root = this->TarjanEntries[j].Root;
      }
    }
  }

  // Check if we have found a component.
  if (this->TarjanEntries[i].Root == i) {
    // Yes.  Create it.
    int c = static_cast<int>(this->Components.size());
    this->Components.emplace_back();
    NodeList& component = this->Components[c];

    // Populate the component list.
    int j;
    do {
      // Get the next member of the component.
      j = this->TarjanStack.top();
      this->TarjanStack.pop();

      // Assign the member to the component.
      this->TarjanComponents[j] = c;
      this->TarjanEntries[j].Root = i;

      // Store the node in its component.
      component.push_back(j);
    } while (j != i);

    // Sort the component members for clarity.
    std::sort(component.begin(), component.end());
  }
}